

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PublicationInfo.cpp
# Opt level: O2

string * __thiscall helics::PublicationInfo::getTargets_abi_cxx11_(PublicationInfo *this)

{
  string *this_00;
  pointer pSVar1;
  pointer pSVar2;
  string local_50;
  
  this_00 = &this->destTargets;
  if ((this->destTargets)._M_string_length == 0) {
    pSVar2 = (this->subscribers).
             super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar1 = (this->subscribers).
             super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pSVar2 != pSVar1) {
      if ((long)pSVar1 - (long)pSVar2 == 0x28) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (this_00,&pSVar2->key);
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (this_00,'[');
        pSVar1 = (this->subscribers).
                 super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pSVar2 = (this->subscribers).
                      super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
                      ._M_impl.super__Vector_impl_data._M_start; pSVar2 != pSVar1;
            pSVar2 = pSVar2 + 1) {
          generateJsonQuotedString(&local_50,&pSVar2->key);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (this_00,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (this_00,',');
        }
        (this->destTargets)._M_dataplus._M_p[(this->destTargets)._M_string_length - 1] = ']';
      }
    }
  }
  return this_00;
}

Assistant:

const std::string& PublicationInfo::getTargets() const
{
    if (destTargets.empty()) {
        if (!subscribers.empty()) {
            if (subscribers.size() == 1) {
                destTargets = subscribers.front().key;
            } else {
                destTargets.push_back('[');
                for (const auto& sub : subscribers) {
                    destTargets.append(generateJsonQuotedString(sub.key));
                    destTargets.push_back(',');
                }
                destTargets.back() = ']';
            }
        }
    }
    return destTargets;
}